

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

vm_obj_id_t CVmObjList::intersect(vm_val_t *l1,vm_val_t *l2)

{
  ushort uVar1;
  CVmObjPageEntry *pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vm_obj_id_t vVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vm_obj_id_t vVar32;
  vm_obj_id_t vVar33;
  int iVar34;
  ushort *puVar35;
  vm_val_t *this;
  long *plVar36;
  long lVar37;
  ulong uVar38;
  uint16_t tmp;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar62;
  int iVar63;
  undefined1 auVar60 [16];
  int iVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vm_val_t curval;
  vm_val_t local_50;
  vm_val_t local_40;
  
  vVar32 = vm_val_t::ll_length(l1);
  vVar33 = vm_val_t::ll_length(l2);
  vVar24 = vVar33;
  if ((int)vVar32 < (int)vVar33) {
    vVar24 = vVar32;
  }
  this = l1;
  if ((int)vVar33 < (int)vVar32) {
    this = l2;
    l2 = l1;
  }
  vVar32 = create(0,(long)(int)vVar24);
  auVar31 = _DAT_002fd350;
  auVar30 = _DAT_002fd340;
  auVar29 = _DAT_002c63f0;
  auVar28 = _DAT_002c63e0;
  auVar27 = _DAT_002c4b80;
  auVar26 = _DAT_002c4b70;
  auVar25 = _DAT_002c4b60;
  pCVar2 = G_obj_table_X.pages_[vVar32 >> 0xc];
  puVar35 = *(ushort **)((long)&pCVar2[vVar32 & 0xfff].ptr_ + 8);
  uVar1 = *puVar35;
  if ((ulong)uVar1 != 0) {
    puVar35 = puVar35 + 1;
    lVar37 = (ulong)uVar1 - 1;
    auVar40._8_4_ = (int)lVar37;
    auVar40._0_8_ = lVar37;
    auVar40._12_4_ = (int)((ulong)lVar37 >> 0x20);
    uVar38 = 0;
    do {
      auVar58._8_4_ = (int)uVar38;
      auVar58._0_8_ = uVar38;
      auVar58._12_4_ = (int)(uVar38 >> 0x20);
      auVar60 = auVar40 ^ auVar27;
      auVar65 = (auVar58 | auVar26) ^ auVar27;
      iVar34 = auVar60._0_4_;
      iVar78 = -(uint)(iVar34 < auVar65._0_4_);
      iVar62 = auVar60._4_4_;
      auVar67._4_4_ = -(uint)(iVar62 < auVar65._4_4_);
      iVar63 = auVar60._8_4_;
      iVar82 = -(uint)(iVar63 < auVar65._8_4_);
      iVar64 = auVar60._12_4_;
      auVar67._12_4_ = -(uint)(iVar64 < auVar65._12_4_);
      auVar41._4_4_ = iVar78;
      auVar41._0_4_ = iVar78;
      auVar41._8_4_ = iVar82;
      auVar41._12_4_ = iVar82;
      auVar41 = pshuflw(in_XMM1,auVar41,0xe8);
      auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar62);
      auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar64);
      auVar66._0_4_ = auVar66._4_4_;
      auVar66._8_4_ = auVar66._12_4_;
      auVar50 = pshuflw(in_XMM2,auVar66,0xe8);
      auVar67._0_4_ = auVar67._4_4_;
      auVar67._8_4_ = auVar67._12_4_;
      auVar65 = pshuflw(auVar41,auVar67,0xe8);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar65 | auVar50 & auVar41) ^ auVar60;
      auVar60 = packssdw(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)puVar35 = 1;
      }
      auVar50._4_4_ = iVar78;
      auVar50._0_4_ = iVar78;
      auVar50._8_4_ = iVar82;
      auVar50._12_4_ = iVar82;
      auVar67 = auVar66 & auVar50 | auVar67;
      auVar60 = packssdw(auVar67,auVar67);
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar65,auVar60 ^ auVar65);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar35 + 5) = 1;
      }
      auVar60 = (auVar58 | auVar25) ^ auVar27;
      auVar51._0_4_ = -(uint)(iVar34 < auVar60._0_4_);
      auVar51._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar51._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar51._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar68._4_4_ = auVar51._0_4_;
      auVar68._0_4_ = auVar51._0_4_;
      auVar68._8_4_ = auVar51._8_4_;
      auVar68._12_4_ = auVar51._8_4_;
      iVar78 = -(uint)(auVar60._4_4_ == iVar62);
      iVar82 = -(uint)(auVar60._12_4_ == iVar64);
      auVar12._4_4_ = iVar78;
      auVar12._0_4_ = iVar78;
      auVar12._8_4_ = iVar82;
      auVar12._12_4_ = iVar82;
      auVar79._4_4_ = auVar51._4_4_;
      auVar79._0_4_ = auVar51._4_4_;
      auVar79._8_4_ = auVar51._12_4_;
      auVar79._12_4_ = auVar51._12_4_;
      auVar60 = auVar12 & auVar68 | auVar79;
      auVar60 = packssdw(auVar60,auVar60);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar3,auVar60 ^ auVar3);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)(puVar35 + 5) = 1;
      }
      auVar60 = pshufhw(auVar60,auVar68,0x84);
      auVar13._4_4_ = iVar78;
      auVar13._0_4_ = iVar78;
      auVar13._8_4_ = iVar82;
      auVar13._12_4_ = iVar82;
      auVar65 = pshufhw(auVar51,auVar13,0x84);
      auVar41 = pshufhw(auVar60,auVar79,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar41 | auVar65 & auVar60) ^ auVar42;
      auVar60 = packssdw(auVar42,auVar42);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)((long)puVar35 + 0xf) = 1;
      }
      auVar60 = (auVar58 | auVar29) ^ auVar27;
      auVar52._0_4_ = -(uint)(iVar34 < auVar60._0_4_);
      auVar52._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar52._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar52._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar14._4_4_ = auVar52._0_4_;
      auVar14._0_4_ = auVar52._0_4_;
      auVar14._8_4_ = auVar52._8_4_;
      auVar14._12_4_ = auVar52._8_4_;
      auVar65 = pshuflw(auVar79,auVar14,0xe8);
      auVar43._0_4_ = -(uint)(auVar60._0_4_ == iVar34);
      auVar43._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
      auVar43._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
      auVar43._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
      auVar69._4_4_ = auVar43._4_4_;
      auVar69._0_4_ = auVar43._4_4_;
      auVar69._8_4_ = auVar43._12_4_;
      auVar69._12_4_ = auVar43._12_4_;
      auVar60 = pshuflw(auVar43,auVar69,0xe8);
      auVar70._4_4_ = auVar52._4_4_;
      auVar70._0_4_ = auVar52._4_4_;
      auVar70._8_4_ = auVar52._12_4_;
      auVar70._12_4_ = auVar52._12_4_;
      auVar41 = pshuflw(auVar52,auVar70,0xe8);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 & auVar65,(auVar41 | auVar60 & auVar65) ^ auVar4);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar35 + 10) = 1;
      }
      auVar15._4_4_ = auVar52._0_4_;
      auVar15._0_4_ = auVar52._0_4_;
      auVar15._8_4_ = auVar52._8_4_;
      auVar15._12_4_ = auVar52._8_4_;
      auVar70 = auVar69 & auVar15 | auVar70;
      auVar41 = packssdw(auVar70,auVar70);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60,auVar41 ^ auVar5);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar35 + 0x19) = 1;
      }
      auVar60 = (auVar58 | auVar28) ^ auVar27;
      auVar53._0_4_ = -(uint)(iVar34 < auVar60._0_4_);
      auVar53._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar53._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar53._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar71._4_4_ = auVar53._0_4_;
      auVar71._0_4_ = auVar53._0_4_;
      auVar71._8_4_ = auVar53._8_4_;
      auVar71._12_4_ = auVar53._8_4_;
      iVar78 = -(uint)(auVar60._4_4_ == iVar62);
      iVar82 = -(uint)(auVar60._12_4_ == iVar64);
      auVar16._4_4_ = iVar78;
      auVar16._0_4_ = iVar78;
      auVar16._8_4_ = iVar82;
      auVar16._12_4_ = iVar82;
      auVar80._4_4_ = auVar53._4_4_;
      auVar80._0_4_ = auVar53._4_4_;
      auVar80._8_4_ = auVar53._12_4_;
      auVar80._12_4_ = auVar53._12_4_;
      auVar60 = auVar16 & auVar71 | auVar80;
      auVar60 = packssdw(auVar60,auVar60);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar6,auVar60 ^ auVar6);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar35 + 0xf) = 1;
      }
      auVar60 = pshufhw(auVar60,auVar71,0x84);
      auVar17._4_4_ = iVar78;
      auVar17._0_4_ = iVar78;
      auVar17._8_4_ = iVar82;
      auVar17._12_4_ = iVar82;
      auVar65 = pshufhw(auVar53,auVar17,0x84);
      auVar41 = pshufhw(auVar60,auVar80,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar41 | auVar65 & auVar60) ^ auVar44;
      auVar60 = packssdw(auVar44,auVar44);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar35 + 0x23) = 1;
      }
      auVar60 = (auVar58 | auVar31) ^ auVar27;
      auVar54._0_4_ = -(uint)(iVar34 < auVar60._0_4_);
      auVar54._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar54._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar54._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar18._4_4_ = auVar54._0_4_;
      auVar18._0_4_ = auVar54._0_4_;
      auVar18._8_4_ = auVar54._8_4_;
      auVar18._12_4_ = auVar54._8_4_;
      auVar65 = pshuflw(auVar80,auVar18,0xe8);
      auVar45._0_4_ = -(uint)(auVar60._0_4_ == iVar34);
      auVar45._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
      auVar45._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
      auVar45._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
      auVar72._4_4_ = auVar45._4_4_;
      auVar72._0_4_ = auVar45._4_4_;
      auVar72._8_4_ = auVar45._12_4_;
      auVar72._12_4_ = auVar45._12_4_;
      auVar60 = pshuflw(auVar45,auVar72,0xe8);
      auVar73._4_4_ = auVar54._4_4_;
      auVar73._0_4_ = auVar54._4_4_;
      auVar73._8_4_ = auVar54._12_4_;
      auVar73._12_4_ = auVar54._12_4_;
      auVar41 = pshuflw(auVar54,auVar73,0xe8);
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar55 = (auVar41 | auVar60 & auVar65) ^ auVar55;
      auVar41 = packssdw(auVar55,auVar55);
      auVar60 = packsswb(auVar60 & auVar65,auVar41);
      if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar35 + 0x14) = 1;
      }
      auVar19._4_4_ = auVar54._0_4_;
      auVar19._0_4_ = auVar54._0_4_;
      auVar19._8_4_ = auVar54._8_4_;
      auVar19._12_4_ = auVar54._8_4_;
      auVar73 = auVar72 & auVar19 | auVar73;
      auVar41 = packssdw(auVar73,auVar73);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar7,auVar41 ^ auVar7);
      auVar60 = packsswb(auVar60,auVar41);
      if ((auVar60._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar35 + 0x2d) = 1;
      }
      auVar60 = (auVar58 | auVar30) ^ auVar27;
      auVar56._0_4_ = -(uint)(iVar34 < auVar60._0_4_);
      auVar56._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar56._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar56._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar74._4_4_ = auVar56._0_4_;
      auVar74._0_4_ = auVar56._0_4_;
      auVar74._8_4_ = auVar56._8_4_;
      auVar74._12_4_ = auVar56._8_4_;
      iVar78 = -(uint)(auVar60._4_4_ == iVar62);
      iVar82 = -(uint)(auVar60._12_4_ == iVar64);
      auVar20._4_4_ = iVar78;
      auVar20._0_4_ = iVar78;
      auVar20._8_4_ = iVar82;
      auVar20._12_4_ = iVar82;
      auVar81._4_4_ = auVar56._4_4_;
      auVar81._0_4_ = auVar56._4_4_;
      auVar81._8_4_ = auVar56._12_4_;
      auVar81._12_4_ = auVar56._12_4_;
      auVar60 = auVar20 & auVar74 | auVar81;
      auVar60 = packssdw(auVar60,auVar60);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar8,auVar60 ^ auVar8);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar35 + 0x19) = 1;
      }
      auVar60 = pshufhw(auVar60,auVar74,0x84);
      auVar21._4_4_ = iVar78;
      auVar21._0_4_ = iVar78;
      auVar21._8_4_ = iVar82;
      auVar21._12_4_ = iVar82;
      auVar65 = pshufhw(auVar56,auVar21,0x84);
      auVar41 = pshufhw(auVar60,auVar81,0x84);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar46 = (auVar41 | auVar65 & auVar60) ^ auVar46;
      auVar60 = packssdw(auVar46,auVar46);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar35 + 0x37) = 1;
      }
      auVar60 = (auVar58 | _DAT_002fd330) ^ auVar27;
      auVar57._0_4_ = -(uint)(iVar34 < auVar60._0_4_);
      auVar57._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar57._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar57._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar22._4_4_ = auVar57._0_4_;
      auVar22._0_4_ = auVar57._0_4_;
      auVar22._8_4_ = auVar57._8_4_;
      auVar22._12_4_ = auVar57._8_4_;
      auVar65 = pshuflw(auVar81,auVar22,0xe8);
      auVar47._0_4_ = -(uint)(auVar60._0_4_ == iVar34);
      auVar47._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
      auVar47._8_4_ = -(uint)(auVar60._8_4_ == iVar63);
      auVar47._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
      auVar75._4_4_ = auVar47._4_4_;
      auVar75._0_4_ = auVar47._4_4_;
      auVar75._8_4_ = auVar47._12_4_;
      auVar75._12_4_ = auVar47._12_4_;
      auVar60 = pshuflw(auVar47,auVar75,0xe8);
      auVar76._4_4_ = auVar57._4_4_;
      auVar76._0_4_ = auVar57._4_4_;
      auVar76._8_4_ = auVar57._12_4_;
      auVar76._12_4_ = auVar57._12_4_;
      auVar41 = pshuflw(auVar57,auVar76,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 & auVar65,(auVar41 | auVar60 & auVar65) ^ auVar9);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar35 + 0x1e) = 1;
      }
      auVar23._4_4_ = auVar57._0_4_;
      auVar23._0_4_ = auVar57._0_4_;
      auVar23._8_4_ = auVar57._8_4_;
      auVar23._12_4_ = auVar57._8_4_;
      auVar76 = auVar75 & auVar23 | auVar76;
      auVar41 = packssdw(auVar76,auVar76);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60,auVar41 ^ auVar10);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar35 + 0x41) = 1;
      }
      auVar60 = (auVar58 | _DAT_002fd320) ^ auVar27;
      auVar48._0_4_ = -(uint)(iVar34 < auVar60._0_4_);
      auVar48._4_4_ = -(uint)(iVar62 < auVar60._4_4_);
      auVar48._8_4_ = -(uint)(iVar63 < auVar60._8_4_);
      auVar48._12_4_ = -(uint)(iVar64 < auVar60._12_4_);
      auVar77._4_4_ = auVar48._0_4_;
      auVar77._0_4_ = auVar48._0_4_;
      auVar77._8_4_ = auVar48._8_4_;
      auVar77._12_4_ = auVar48._8_4_;
      auVar59._4_4_ = -(uint)(auVar60._4_4_ == iVar62);
      auVar59._12_4_ = -(uint)(auVar60._12_4_ == iVar64);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      auVar61._4_4_ = auVar48._4_4_;
      auVar61._0_4_ = auVar48._4_4_;
      auVar61._8_4_ = auVar48._12_4_;
      auVar61._12_4_ = auVar48._12_4_;
      auVar41 = auVar59 & auVar77 | auVar61;
      auVar60 = packssdw(auVar48,auVar41);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar60 = packssdw(auVar60 ^ auVar11,auVar60 ^ auVar11);
      auVar60 = packsswb(auVar60,auVar60);
      if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)(puVar35 + 0x23) = 1;
      }
      auVar60 = pshufhw(auVar60,auVar77,0x84);
      in_XMM2 = pshufhw(auVar41,auVar59,0x84);
      in_XMM2 = in_XMM2 & auVar60;
      auVar60 = pshufhw(auVar60,auVar61,0x84);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar60 | in_XMM2) ^ auVar49;
      auVar60 = packssdw(auVar49,auVar49);
      in_XMM1 = packsswb(auVar60,auVar60);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)puVar35 + 0x4b) = 1;
      }
      uVar38 = uVar38 + 0x10;
      puVar35 = puVar35 + 0x28;
    } while ((uVar1 + 0xf & 0xfffffff0) != uVar38);
  }
  plVar36 = (long *)((long)&pCVar2[vVar32 & 0xfff].ptr_ + 8);
  if ((int)vVar24 < 1) {
    lVar37 = 0;
  }
  else {
    lVar37 = 0;
    vVar33 = 1;
    do {
      local_50.typ = VM_INT;
      local_50.val.obj = vVar33;
      vm_val_t::ll_index(this,&local_40,&local_50);
      iVar34 = find_in_list(l2,&local_40,(size_t *)0x0);
      if (iVar34 != 0) {
        vmb_put_dh((char *)(*plVar36 + lVar37 * 5 + 2),&local_40);
        lVar37 = lVar37 + 1;
      }
      bVar39 = vVar33 != vVar24;
      vVar33 = vVar33 + 1;
    } while (bVar39);
  }
  *(short *)*plVar36 = (short)lVar37;
  return vVar32;
}

Assistant:

vm_obj_id_t CVmObjList::intersect(VMG_ const vm_val_t *l1,
                                  const vm_val_t *l2)
{
    int cnt1;
    int cnt2;
    int idx;
    vm_obj_id_t resobj;
    CVmObjList *reslst;
    size_t residx;

    /* get the lengths of the lists */
    cnt1 = l1->ll_length(vmg0_);
    cnt2 = l2->ll_length(vmg0_);

    /* if the first list is larger than the second, swap them */
    if (cnt1 > cnt2)
    {
        /* swap the vm_val_t pointers */
        const vm_val_t *tmp = l1;
        l1 = l2;
        l2 = tmp;

        /* forget the larger count; just copy the smaller list */
        cnt1 = cnt2;
    }

    /* 
     *   Allocate our result list.  The result list can't have any more
     *   elements in it than the shorter of the two lists, whose length is
     *   now in cnt1. 
     */
    resobj = create(vmg_ FALSE, cnt1);
    reslst = (CVmObjList *)vm_objp(vmg_ resobj);
    reslst->cons_clear();

    /* we haven't put any elements in the result list yet */
    residx = 0;

    /* 
     *   for each element in the first list, find the element in the
     *   second list 
     */
    for (idx = 1 ; idx <= cnt1 ; ++idx)
    {
        vm_val_t curval;
        
        /* get this element from the first list */
        l1->ll_index(vmg_ &curval, idx);
        
        /* find the element in the second list */
        if (find_in_list(vmg_ l2, &curval, 0))
        {
            /* we found it - copy it into the result list */
            reslst->cons_set_element(residx, &curval);

            /* count the new entry in the result list */
            ++residx;
        }
    }

    /* 
     *   set the actual result length, which might be shorter than the
     *   amount we allocated 
     */
    reslst->cons_set_len(residx);

    /* return the result list */
    return resobj;
}